

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O2

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  size_t sVar4;
  int i;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int j;
  ulong uVar10;
  uint uVar11;
  int _c;
  Mat local_70;
  
  iVar6 = bottom_top_blob->dims;
  if (iVar6 == 3) {
    uVar11 = bottom_top_blob->h * bottom_top_blob->w;
    uVar7 = 0;
    uVar8 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar8 = uVar7;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (_c = (int)uVar7, _c != iVar6) {
      Mat::channel(&local_70,bottom_top_blob,_c);
      pvVar5 = local_70.data;
      Mat::~Mat(&local_70);
      uVar9 = 0;
      if (1 < this->num_slope) {
        uVar9 = uVar7;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar9 * 4);
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        fVar2 = *(float *)((long)pvVar5 + uVar7 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar5 + uVar7 * 4) = fVar2 * fVar1;
        }
      }
      uVar7 = (ulong)(_c + 1);
    }
  }
  else if (iVar6 == 2) {
    uVar11 = bottom_top_blob->w;
    pvVar5 = bottom_top_blob->data;
    uVar8 = 0;
    if (0 < (int)uVar11) {
      uVar8 = (ulong)uVar11;
    }
    iVar6 = this->num_slope;
    uVar7 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar7 = 0;
    }
    sVar4 = bottom_top_blob->elemsize;
    for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      uVar10 = uVar9 & 0xffffffff;
      if (iVar6 < 2) {
        uVar10 = 0;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar10 * 4);
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        fVar2 = *(float *)((long)pvVar5 + uVar10 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar5 + uVar10 * 4) = fVar2 * fVar1;
        }
      }
      pvVar5 = (void *)((long)pvVar5 + (long)(int)uVar11 * sVar4);
    }
  }
  else if (iVar6 == 1) {
    uVar11 = bottom_top_blob->w;
    pvVar5 = bottom_top_blob->data;
    pfVar3 = (float *)(this->slope_data).data;
    if (this->num_slope < 2) {
      fVar1 = *pfVar3;
      uVar7 = 0;
      uVar8 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        fVar2 = *(float *)((long)pvVar5 + uVar7 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar5 + uVar7 * 4) = fVar2 * fVar1;
        }
      }
    }
    else {
      uVar7 = 0;
      uVar8 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        fVar1 = *(float *)((long)pvVar5 + uVar7 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar5 + uVar7 * 4) = fVar1 * pfVar3[uVar7];
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j=0; j<w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}